

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<12,_2,_5,_2,_5>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float afVar1 [2];
  float afVar2 [2];
  Matrix<float,_2,_2> *pMVar3;
  long lVar4;
  int col;
  long lVar5;
  float *pfVar6;
  int col_1;
  bool bVar7;
  undefined4 uVar8;
  Mat2 m;
  Mat2 m_1;
  Matrix<float,_2,_2> local_78;
  float afStack_64 [5];
  int local_50 [6];
  Matrix<float,_2,_2> local_38;
  undefined4 local_20;
  float local_1c;
  undefined4 local_18;
  float local_14;
  
  pMVar3 = &local_78;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar4 != lVar5) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pMVar3 + lVar5 * 8) = uVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    pMVar3 = (Matrix<float,_2,_2> *)((long)pMVar3 + 4);
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  afVar1 = *(float (*) [2])evalCtx->in[0].m_data;
  local_78.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
  afVar2 = *(float (*) [2])evalCtx->in[1].m_data;
  local_78.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
  pfVar6 = (float *)&local_38;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar4 != lVar5) {
        uVar8 = 0;
      }
      pfVar6[lVar5 * 2] = (float)uVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    pfVar6 = pfVar6 + 1;
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  local_38.m_data.m_data[0].m_data = afVar1;
  local_38.m_data.m_data[1].m_data = afVar2;
  tcu::operator-((tcu *)&local_20,&local_78,&local_38);
  afStack_64[2] = (float)local_20;
  afStack_64[3] = (float)local_18;
  afStack_64[4] = local_1c + local_14;
  local_50[2] = 0;
  local_50[3] = 1;
  local_50[4] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[local_50[lVar4]] = afStack_64[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) - getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}